

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

string * convertUnicodeCharToUtf8_abi_cxx11_(string *__return_storage_ptr__,char32_t character)

{
  char cVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = (char)__return_storage_ptr__;
  if (0x7f < (uint)character) {
    if ((uint)character < 0x800) {
      std::__cxx11::string::push_back(cVar1);
    }
    else {
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
    }
  }
  std::__cxx11::string::push_back(cVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string convertUnicodeCharToUtf8(char32_t character)
{
	std::string result;
	
	if (character < 0x80)
	{
		result += character & 0x7F;
	} else if (character < 0x800)
	{
		result += 0xC0 | ((character >> 6) & 0x1F);
		result += (0x80 | (character & 0x3F));
	} else {
		result += 0xE0 | ((character >> 12) & 0xF);
		result += 0x80 | ((character >> 6) & 0x3F);
		result += 0x80 | (character & 0x3F);
	}

	return result;
}